

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O0

bool __thiscall
cmNinjaNormalTargetGenerator::CheckUseResponseFileForLibraries
          (cmNinjaNormalTargetGenerator *this,string *l)

{
  bool bVar1;
  cmValue local_78;
  cmValue val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  string responseVar;
  string *l_local;
  cmNinjaNormalTargetGenerator *this_local;
  
  responseVar.field_2._8_8_ = l;
  std::operator+(&local_60,"CMAKE_",l);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 &local_60,"_USE_RESPONSE_FILE_FOR_LIBRARIES");
  std::__cxx11::string::~string((string *)&local_60);
  local_78 = cmMakefile::GetDefinition
                       ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.Makefile,
                        (string *)local_40);
  bVar1 = cmValue::operator_cast_to_bool(&local_78);
  if (bVar1) {
    this_local._7_1_ = cmValue::IsOn(&local_78);
  }
  else {
    this_local._7_1_ = true;
  }
  std::__cxx11::string::~string((string *)local_40);
  return this_local._7_1_;
}

Assistant:

bool cmNinjaNormalTargetGenerator::CheckUseResponseFileForLibraries(
  const std::string& l) const
{
  // Check for an explicit setting one way or the other.
  std::string const responseVar =
    "CMAKE_" + l + "_USE_RESPONSE_FILE_FOR_LIBRARIES";

  // If the option is defined, read it's value
  if (cmValue val = this->Makefile->GetDefinition(responseVar)) {
    return val.IsOn();
  }

  // Default to true
  return true;
}